

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O2

void __thiscall
draco::SequentialIntegerAttributeDecoder::StoreTypedValues<unsigned_char>
          (SequentialIntegerAttributeDecoder *this,uint32_t num_values)

{
  PointAttribute *pPVar1;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> __src;
  long lVar2;
  ulong uVar3;
  uint32_t i;
  uint32_t uVar4;
  long lVar5;
  ulong __n;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> att_val;
  long local_48;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_38;
  
  __n = (ulong)(((this->super_SequentialAttributeDecoder).attribute_)->super_GeometryAttribute).
               num_components_;
  __src.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)operator_new__(__n)
  ;
  pPVar1 = (this->super_SequentialAttributeDecoder).portable_attribute_._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  uVar4 = 0;
  if (pPVar1->num_unique_entries_ == 0) {
    local_48 = 0;
  }
  else {
    local_48 = *(long *)(pPVar1->super_GeometryAttribute).buffer_ +
               (pPVar1->super_GeometryAttribute).byte_offset_;
  }
  lVar2 = 0;
  lVar5 = 0;
  local_38._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       __src.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  for (; uVar4 != num_values; uVar4 = uVar4 + 1) {
    for (uVar3 = 0; __n != uVar3; uVar3 = uVar3 + 1) {
      *(undefined1 *)
       ((long)__src.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar3) =
           *(undefined1 *)(local_48 + (long)(int)lVar5 * 4 + uVar3 * 4);
    }
    memcpy((void *)(*(long *)&(((((this->super_SequentialAttributeDecoder).attribute_)->
                                attribute_buffer_)._M_t.
                                super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                                .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl)->
                              data_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> +
                   lVar2),
           (void *)__src.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,__n);
    lVar2 = lVar2 + __n;
    lVar5 = (long)(int)lVar5 + uVar3;
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_38);
  return;
}

Assistant:

void SequentialIntegerAttributeDecoder::StoreTypedValues(uint32_t num_values) {
  const int num_components = attribute()->num_components();
  const int entry_size = sizeof(AttributeTypeT) * num_components;
  const std::unique_ptr<AttributeTypeT[]> att_val(
      new AttributeTypeT[num_components]);
  const int32_t *const portable_attribute_data = GetPortableAttributeData();
  int val_id = 0;
  int out_byte_pos = 0;
  for (uint32_t i = 0; i < num_values; ++i) {
    for (int c = 0; c < num_components; ++c) {
      const AttributeTypeT value =
          static_cast<AttributeTypeT>(portable_attribute_data[val_id++]);
      att_val[c] = value;
    }
    // Store the integer value into the attribute buffer.
    attribute()->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
    out_byte_pos += entry_size;
  }
}